

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O2

void __thiscall wasm::ModuleReader::readText(ModuleReader *this,string *filename,Module *wasm)

{
  bool bVar1;
  ostream *poVar2;
  BinaryOption in_ECX;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  
  bVar1 = isDebugEnabled("writer");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"reading text from ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::operator<<(poVar2,"\n");
  }
  read_file<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (wasm *)filename,(string *)0x1,in_ECX);
  std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<std::__cxx11::string&>
            ((_Optional_payload_base<std::__cxx11::string> *)&local_60,filename);
  readTextData((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_60,(string *)local_38,wasm,in_ECX);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_60);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ModuleReader::readText(std::string filename, Module& wasm) {
  BYN_TRACE("reading text from " << filename << "\n");
  auto input(read_file<std::string>(filename, Flags::Text));
  readTextData(filename, input, wasm, profile);
}